

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_31::NetworkHttpClient::NetworkHttpClient
          (NetworkHttpClient *this,Timer *timer,HttpHeaderTable *responseHeaderTable,
          Network *network,Maybe<kj::Network_&> tlsNetwork,HttpClientSettings settings)

{
  EntropySource *pEVar1;
  HttpClientSettings *pHVar2;
  Network *network_local;
  HttpHeaderTable *responseHeaderTable_local;
  Timer *timer_local;
  NetworkHttpClient *this_local;
  Maybe<kj::Network_&> tlsNetwork_local;
  
  this_local = (NetworkHttpClient *)tlsNetwork.ptr;
  HttpClient::HttpClient(&this->super_HttpClient);
  TaskSet::ErrorHandler::ErrorHandler(&this->super_ErrorHandler);
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)&PTR_request_007d4bd0;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_007d4c00;
  this->timer = timer;
  this->responseHeaderTable = responseHeaderTable;
  this->network = network;
  Maybe<kj::Network_&>::Maybe<kj::Network>(&this->tlsNetwork,(Maybe<kj::Network_&> *)&this_local);
  pHVar2 = mv<kj::HttpClientSettings>(&settings);
  pEVar1 = (pHVar2->entropySource).ptr;
  (this->settings).idleTimout.value = (pHVar2->idleTimout).value;
  (this->settings).entropySource.ptr = pEVar1;
  std::
  map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
  ::map(&this->httpHosts);
  std::
  map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
  ::map(&this->httpsHosts);
  TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  return;
}

Assistant:

NetworkHttpClient(kj::Timer& timer, HttpHeaderTable& responseHeaderTable,
                    kj::Network& network, kj::Maybe<kj::Network&> tlsNetwork,
                    HttpClientSettings settings)
      : timer(timer),
        responseHeaderTable(responseHeaderTable),
        network(network),
        tlsNetwork(tlsNetwork),
        settings(kj::mv(settings)),
        tasks(*this) {}